

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer-test.cc
# Opt level: O0

void __thiscall
Buffer_search_not_present_Test::~Buffer_search_not_present_Test
          (Buffer_search_not_present_Test *this)

{
  Buffer_search_not_present_Test *this_local;
  
  ~Buffer_search_not_present_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Buffer, search_not_present) {
    BufferWithReadonlyStrings local;
    auto constexpr expected_pos = size_t { 999 };
    auto constexpr needle = std::string_view { "test" };
    auto pos = expected_pos;

    // confirm that the search fails and pos is unchanged
    EXPECT_EQ(-1, bfy_buffer_search_all(&local.buf, std::data(needle), std::size(needle), &pos));
    EXPECT_EQ(expected_pos, pos);
}